

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.c
# Opt level: O2

void selecte(HuffmanTree *huffmanTree,int n,int *s1,int *s2)

{
  HuffmanTree paVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)n;
  if (n < 1) {
    uVar4 = uVar3;
  }
  uVar8 = 1;
  for (; (uVar6 = (int)uVar4 + 1, uVar4 << 4 != uVar3 &&
         (uVar6 = uVar8, *(int *)((long)&(*huffmanTree)[1].parent + uVar3) != 0));
      uVar3 = uVar3 + 0x10) {
    uVar8 = uVar8 + 1;
  }
  uVar8 = 1;
  for (lVar9 = 0; uVar4 << 4 != lVar9; lVar9 = lVar9 + 0x10) {
    paVar1 = *huffmanTree;
    uVar2 = uVar6;
    if ((*(int *)((long)&paVar1[1].parent + lVar9) == 0) &&
       (uVar2 = uVar8, paVar1[(int)uVar6].weight <= *(uint *)((long)&paVar1[1].weight + lVar9))) {
      uVar2 = uVar6;
    }
    uVar6 = uVar2;
    uVar8 = uVar8 + 1;
  }
  *s1 = uVar6;
  lVar9 = 0x14;
  for (uVar3 = 1; uVar3 - uVar4 != 1; uVar3 = uVar3 + 1) {
    if ((*(int *)((long)&(*huffmanTree)->weight + lVar9) == 0) && (uVar6 != uVar3))
    goto LAB_0010126e;
    lVar9 = lVar9 + 0x10;
  }
  uVar3 = (ulong)uVar6;
LAB_0010126e:
  uVar7 = 1;
  for (lVar9 = 0; uVar4 << 4 != lVar9; lVar9 = lVar9 + 0x10) {
    paVar1 = *huffmanTree;
    uVar5 = uVar3;
    if (((*(int *)((long)&paVar1[1].parent + lVar9) == 0) && ((ulong)uVar6 * 0x10 + -0x10 != lVar9))
       && (uVar5 = uVar7, paVar1[(int)uVar3].weight <= *(uint *)((long)&paVar1[1].weight + lVar9)))
    {
      uVar5 = uVar3 & 0xffffffff;
    }
    uVar7 = (ulong)((int)uVar7 + 1);
    uVar3 = uVar5;
  }
  *s2 = (int)uVar3;
  return;
}

Assistant:

void selecte(HuffmanTree *huffmanTree,int n,int *s1,int *s2){
    //标记i
    int i = 0;
    //记录最小权值
    int min;
    //遍历全部节点，找出单节点
    for(i = 1;i <= n;i++){
        //如果此结点的父亲没有，那麽把结点好赋值给min，跳出循环
        if((*huffmanTree)[i].parent == 0){
            min = i;
            break;
        }
    }
    //继续遍历全部节点，找出权值最小节点
    for(i = 1; i <= n;i++){
        if((*huffmanTree)[i].parent == 0){
            if((*huffmanTree)[i].weight < (*huffmanTree)[min].weight){
                min = i;
            }
        }
    }
    //找到了最小权值的结点，s1指向
    *s1 = min;
    //遍历全部结点
    for(i = 1;i <= n;i++){
        //找出下一个节点，且没有被s1指向，那麽赋值i给min，跳出循环
        if((*huffmanTree)[i].parent == 0 && i!= (*s1)){
            min = i;
            break;
        }
    }
    //继续遍历全部结点，找到权值最小的那一个
    for(i = 1; i <= n;i++){
        if((*huffmanTree)[i].parent == 0 && i!= (*s1)){
            if((*huffmanTree)[i].weight < (*huffmanTree)[min].weight){
                min = i;
            }
        }
    }
    //s2指针指向第二个权值最小的叶子结点
    *s2 = min;
}